

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::makeAddGtuTrap
          (Replacer *this,Expression *leftOperand,Expression *rightOperand,Expression *limit)

{
  BinaryOp op;
  BinaryOp op_00;
  Binary *pBVar1;
  Expression *ifTrue;
  If *pIVar2;
  Expression *gtuTrap;
  Expression *limit_local;
  Expression *rightOperand_local;
  Expression *leftOperand_local;
  Replacer *this_local;
  
  op = Abstract::getBinary((Type)(this->parent->pointerType).id,GtU);
  op_00 = Abstract::getBinary((Type)(this->parent->pointerType).id,Add);
  pBVar1 = Builder::makeBinary(&this->builder,op_00,leftOperand,rightOperand);
  pBVar1 = Builder::makeBinary(&this->builder,op,(Expression *)pBVar1,limit);
  ifTrue = (Expression *)Builder::makeUnreachable(&this->builder);
  pIVar2 = Builder::makeIf(&this->builder,(Expression *)pBVar1,ifTrue,(Expression *)0x0);
  return (Expression *)pIVar2;
}

Assistant:

Expression* makeAddGtuTrap(Expression* leftOperand,
                               Expression* rightOperand,
                               Expression* limit) {
      Expression* gtuTrap = builder.makeIf(
        builder.makeBinary(
          Abstract::getBinary(parent.pointerType, Abstract::GtU),
          builder.makeBinary(
            Abstract::getBinary(parent.pointerType, Abstract::Add),
            leftOperand,
            rightOperand),
          limit),
        builder.makeUnreachable());
      return gtuTrap;
    }